

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O3

void avl_remove(avl_tree *tree,avl_node *node)

{
  avl_node **ppaVar1;
  avl_node *paVar2;
  uint uVar3;
  int bf;
  avl_node *paVar4;
  avl_node *paVar5;
  uint uVar6;
  avl_node *paVar7;
  ulong uVar8;
  avl_node **ppaVar9;
  avl_node *paVar10;
  uint uVar11;
  
  if (node != (avl_node *)0x0) {
    ppaVar1 = &node->right;
    paVar7 = (avl_node *)0x0;
    ppaVar9 = ppaVar1;
    do {
      paVar5 = paVar7;
      paVar7 = *ppaVar9;
      ppaVar9 = &paVar7->left;
    } while (paVar7 != (avl_node *)0x0);
    if (paVar5 == (avl_node *)0x0) {
      paVar7 = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc);
      if (paVar7 == (avl_node *)0x0) {
        paVar5 = node->left;
        bf = 0;
      }
      else {
        paVar5 = node->left;
        if (paVar7->left == node) {
          paVar7->left = paVar5;
          bf = 1;
        }
        else {
          paVar7->right = paVar5;
          bf = -1;
        }
      }
      if (paVar5 != (avl_node *)0x0) {
        paVar5->parent = (avl_node *)((ulong)((uint)paVar5->parent & 3) | (ulong)paVar7);
        paVar7 = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc);
      }
    }
    else {
      paVar7 = (avl_node *)((ulong)paVar5->parent & 0xfffffffffffffffc);
      if (paVar7 != node && paVar7 != (avl_node *)0x0) {
        paVar10 = paVar5->right;
        paVar7->left = paVar10;
        if (paVar10 != (avl_node *)0x0) {
          paVar10->parent = (avl_node *)((ulong)((uint)paVar10->parent & 3) | (ulong)paVar7);
        }
      }
      uVar8 = (ulong)node->parent & 0xfffffffffffffffc;
      if (uVar8 != 0) {
        *(avl_node **)(uVar8 + 8 + (ulong)(*(avl_node **)(uVar8 + 8) != node) * 8) = paVar5;
      }
      if (*ppaVar1 == paVar5) {
        bf = -1;
        paVar7 = paVar5;
      }
      else {
        paVar5->right = *ppaVar1;
        paVar7 = *ppaVar1;
        if (paVar7 != (avl_node *)0x0) {
          paVar7->parent = (avl_node *)((ulong)((uint)paVar7->parent & 3) | (ulong)paVar5);
        }
        bf = 1;
        paVar7 = (avl_node *)((ulong)paVar5->parent & 0xfffffffffffffffc);
      }
      paVar10 = node->left;
      paVar5->left = paVar10;
      if (paVar10 != (avl_node *)0x0) {
        paVar10->parent = (avl_node *)((ulong)((uint)paVar10->parent & 3) | (ulong)paVar5);
      }
      uVar8 = (ulong)node->parent & 0xfffffffffffffffc;
      paVar5->parent = (avl_node *)((uint)paVar5->parent & 3 | uVar8);
      paVar5->parent = (avl_node *)((uint)node->parent & 3 | uVar8);
    }
    if (tree->root == node) {
      tree->root = paVar5;
    }
    do {
      if (paVar7 == (avl_node *)0x0) {
        return;
      }
      paVar5 = paVar7->parent;
      paVar10 = (avl_node *)((ulong)paVar5 & 0xfffffffffffffffc);
      if (paVar10 == (avl_node *)0x0) {
        if (paVar7 == tree->root) {
          paVar7 = _balance_tree(tree->root,bf);
          tree->root = paVar7;
          return;
        }
      }
      else {
        paVar2 = paVar10->right;
        paVar4 = _balance_tree(paVar7,bf);
        (&paVar10->left)[paVar2 == paVar7] = paVar4;
        if ((paVar4->left != (avl_node *)0x0) || (paVar4->right != (avl_node *)0x0)) {
          uVar11 = ((uint)paVar5 & 3) - 1;
          uVar3 = -uVar11;
          if (0 < (int)uVar11) {
            uVar3 = uVar11;
          }
          uVar6 = (*(uint *)&paVar4->parent & 3) - 1;
          uVar11 = -uVar6;
          if (0 < (int)uVar6) {
            uVar11 = uVar6;
          }
          if (uVar3 <= uVar11) {
            return;
          }
        }
        bf = (uint)(paVar10->left == paVar4) * 2 + -1;
      }
      paVar7 = paVar10;
    } while (bf != 0);
  }
  return;
}

Assistant:

void avl_remove(struct avl_tree *tree,
                struct avl_node *node)
{
    __AVL_DEBUG_REMOVE(node);

    // not found
    if (node == NULL) return;

    struct avl_tree right_subtree;
    struct avl_node *p=NULL,*cur, *next=NULL;
    int bf = 0, bf_old;


#ifdef _AVL_NEXT_POINTER
    if (node->prev) node->prev->next = node->next;
    if (node->next) node->next->prev = node->prev;
#endif

    // find smallest node in right sub-tree
    right_subtree.root = node->right;
    next = avl_first(&right_subtree);

    if (next) {
        // 1. NEXT exists
        if (avl_parent(next)) {
            if (avl_parent(next) != node) {
                // NODE is not NEXT's direct parent
                // MUST ensure NEXT should be *left child* of its parent
                // MUST ensure NEXT doesn't have right child
                avl_parent(next)->left = next->right;
                if (next->right)
                    avl_set_parent(next->right, avl_parent(next));
            }
        }
        if (avl_parent(node)) {
            // replace NODE by NEXT
            if (avl_parent(node)->left == node) {
                avl_parent(node)->left = next;
            } else {
                avl_parent(node)->right = next;
            }
        }

        // re-link pointers
        if (node->right != next) {
            next->right = node->right;
            if (node->right) avl_set_parent(node->right, next);
            cur = avl_parent(next);
            bf = 1;
        }else{
            cur = next;
            bf = -1;
        }

        next->left = node->left;
        if (node->left) avl_set_parent(node->left, next);
        avl_set_parent(next, avl_parent(node));

        // inherit NODE's balance factor
        avl_set_bf(next, avl_bf(node));

    } else {
        // 2. NEXT == NULL (only when there's no right sub-tree)
        p = avl_parent(node);
        if (p) {
            if (p->left == node) {
                p->left = node->left;
                bf = 1;
            } else {
                p->right = node->left;
                bf = -1;
            }
        }
        if (node->left)
            avl_set_parent(node->left, p);

        cur = avl_parent(node);
    }

    // reset root
    if (tree->root == node) {
        tree->root = next;
        if (next == NULL) {
            if (node->left) tree->root = node->left;
        }
    }

    // recursive balancing process .. scan from CUR to root
    while(cur) {
        p = avl_parent(cur);
        if (p) {
            // if parent exists
            bf_old = avl_bf(cur);

            if (p->right == cur) {
                cur = _balance_tree(cur, bf);
                p->right = cur;
            }else {
                cur = _balance_tree(cur, bf);
                p->left = cur;
            }

            // calculate balance facter BF for parent
            if (cur->left == NULL && cur->right == NULL) {
                // leaf node
                if (p->left == cur) bf = 1;
                else bf = -1;
            } else {
                // index ndoe
                bf = 0;
                if (_abs(bf_old) > _abs(avl_bf(cur))) {
                    // if ABS of balance factor decreases
                    // cascade to parent
                    if (p->left == cur) bf = 1;
                    else bf = -1;
                }
            }

        } else if(cur == tree->root){
            tree->root = _balance_tree(tree->root, bf);
            break;
        }
        if (bf == 0) break;

        cur = p;
    }

    __AVL_DEBUG_DISPLAY(tree);
}